

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_parser.cpp
# Opt level: O0

uint __thiscall Fossilize::CLIParser::next_uint(CLIParser *this)

{
  char *pcVar1;
  uint uVar2;
  unsigned_long uVar3;
  allocator local_39;
  string local_38;
  unsigned_long local_18;
  unsigned_long val;
  CLIParser *this_local;
  
  val = (unsigned_long)this;
  if (this->argc == 0) {
    fprintf(_stderr,"Fossilize ERROR: Tried to parse uint, but nothing left in arguments.\n");
    fflush(_stderr);
    exit(1);
  }
  pcVar1 = *this->argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,pcVar1,&local_39);
  uVar3 = std::__cxx11::stoul(&local_38,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = uVar3;
  uVar2 = std::numeric_limits<unsigned_int>::max();
  if (uVar2 < uVar3) {
    fprintf(_stderr,"Fossilize ERROR: next_uint() out of range.\n");
    fflush(_stderr);
    exit(1);
  }
  this->argc = this->argc + -1;
  this->argv = this->argv + 1;
  return (uint)local_18;
}

Assistant:

unsigned CLIParser::next_uint()
{
	if (!argc)
	{
		LOGE("Tried to parse uint, but nothing left in arguments.\n");
		exit(EXIT_FAILURE);
	}

	auto val = stoul(*argv);
	if (val > numeric_limits<unsigned>::max())
	{
		LOGE("next_uint() out of range.\n");
		exit(EXIT_FAILURE);
	}

	argc--;
	argv++;

	return unsigned(val);
}